

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O0

int __thiscall Js::BigUInt::Compare(BigUInt *this,BigUInt *pbi)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_24;
  int32 ilu;
  BigUInt *pbi_local;
  BigUInt *this_local;
  
  if (this == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x13d,"(this)","this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x13e,"(pbi)","pbi");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  AssertValid(pbi,true);
  if (pbi->m_clu < this->m_clu) {
    this_local._4_4_ = 1;
  }
  else if (this->m_clu < pbi->m_clu) {
    this_local._4_4_ = -1;
  }
  else if (this->m_clu == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_24 = this->m_clu;
    do {
      local_24 = local_24 + -1;
      if (this->m_prglu[local_24] != pbi->m_prglu[local_24]) {
        if ((local_24 < 0) || (this->m_clu <= local_24)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x14f,"(ilu >= 0 && ilu < m_clu)","ilu >= 0 && ilu < m_clu");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        if (this->m_prglu[local_24] == pbi->m_prglu[local_24]) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x150,"(m_prglu[ilu] != pbi->m_prglu[ilu])",
                                      "m_prglu[ilu] != pbi->m_prglu[ilu]");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        if (this->m_prglu[local_24] <= pbi->m_prglu[local_24]) {
          return -1;
        }
        return 1;
      }
    } while (local_24 != 0);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int BigUInt::Compare(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);

        int32 ilu;

        if (m_clu > pbi->m_clu)
            return 1;
        if (m_clu < pbi->m_clu)
            return -1;
        if (0 == m_clu)
            return 0;

#pragma prefast(suppress:__WARNING_LOOP_ONLY_EXECUTED_ONCE,"noise")
        for (ilu = m_clu - 1; m_prglu[ilu] == pbi->m_prglu[ilu]; ilu--)
        {
            if (0 == ilu)
                return 0;
        }
        Assert(ilu >= 0 && ilu < m_clu);
        Assert(m_prglu[ilu] != pbi->m_prglu[ilu]);

        return (m_prglu[ilu] > pbi->m_prglu[ilu]) ? 1 : -1;
    }